

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void bc_trie_foreach(bc_trie_t *trie,bc_trie_foreach_func_t func,void *user_data)

{
  bc_string_t *pbVar1;
  
  if (((trie != (bc_trie_t *)0x0) && (func != (bc_trie_foreach_func_t)0x0)) &&
     (trie->root != (bc_trie_node_t *)0x0)) {
    pbVar1 = (bc_string_t *)bc_malloc(0x18);
    pbVar1->str = (char *)0x0;
    pbVar1->len = 0;
    pbVar1->allocated_len = 0;
    pbVar1 = bc_string_append_len(pbVar1,"",0);
    bc_trie_foreach_node(trie->root,pbVar1,func,user_data);
    if (pbVar1 != (bc_string_t *)0x0) {
      free(pbVar1->str);
      free(pbVar1);
      return;
    }
  }
  return;
}

Assistant:

void
bc_trie_foreach(bc_trie_t *trie, bc_trie_foreach_func_t func,
    void *user_data)
{
    if (trie == NULL || trie->root == NULL || func == NULL)
        return;

    bc_string_t *str = bc_string_new();
    bc_trie_foreach_node(trie->root, str, func, user_data);
    bc_string_free(str, true);
}